

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::print_typed_attr<std::array<float,4ul>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttribute<tinyusdz::Animatable<std::array<float,_4UL>_>_> *attr,string *name,
          uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  tinyusdz tVar2;
  string *psVar3;
  tinyusdz tVar4;
  byte bVar5;
  bool bVar6;
  ostream *poVar7;
  uint32_t indent_00;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  undefined8 extraout_RDX;
  long lVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  array<float,_4UL> a;
  stringstream ss;
  string local_258;
  undefined4 local_238;
  undefined4 local_234;
  TypedAttribute<tinyusdz::Animatable<std::array<float,_4UL>_>_> *local_230;
  string *local_228;
  tinyusdz local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  size_type sStack_210;
  undefined2 local_208;
  TypedTimeSamples<std::array<float,_4UL>_> local_200;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_230 = attr;
  local_228 = name;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  tVar2 = this[0x228];
  if ((((tVar2 == (tinyusdz)0x0) && (*(long *)(this + 0x218) == *(long *)(this + 0x210))) &&
      (this[0x208] == (tinyusdz)0x0)) && (this[0x268] != (tinyusdz)0x1)) goto LAB_002fe0b7;
  lVar8 = *(long *)(this + 0x218);
  if ((lVar8 == *(long *)(this + 0x210) && tVar2 == (tinyusdz)0x0) && (this[0x268] == (tinyusdz)0x0)
     ) {
    local_238 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),this[0x208]);
  }
  else {
    local_238 = 0;
  }
  bVar10 = lVar8 != *(long *)(this + 0x210);
  local_220 = tVar2;
  local_1e0 = __return_storage_ptr__;
  if (((byte)tVar2 ^ 1) == 0) {
    local_208 = *(undefined2 *)(this + 0x240);
    local_218 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)(this + 0x230);
    sStack_210 = *(size_type *)(this + 0x238);
    ::std::
    vector<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
    ::vector(&local_200._samples,
             (vector<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
              *)(this + 0x248));
    local_200._dirty = *(bool *)(this + 0x260);
  }
  tVar4 = local_220;
  indent_00 = (uint32_t)lVar8;
  bVar5 = (byte)local_208;
  if (local_220 == (tinyusdz)0x1) {
    if ((tinyusdz)local_200._dirty == (tinyusdz)0x1) {
      TypedTimeSamples<std::array<float,_4UL>_>::update(&local_200);
    }
    local_234 = (undefined4)
                CONCAT71((int7)((ulong)local_200._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish >> 8),
                         local_200._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                         local_200._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    local_234 = 0;
  }
  if (((local_220 == (tinyusdz)0x1) && (local_208._1_1_ == '\0')) && ((byte)local_208 == '\0')) {
    bVar11 = local_200._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_200._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar11 = false;
  }
  bVar6 = AttrMetas::authored((AttrMetas *)this);
  psVar3 = local_228;
  if (((bVar6) || ((byte)(bVar10 & ((byte)tVar2 ^ 1) | bVar11) != 1)) ||
     (n_01 = n,
     ((char)local_238 != '\0' || this[0x268] != (tinyusdz)0x0) || ((byte)tVar4 & bVar5) != 0)) {
    pprint::Indent_abi_cxx11_(&local_258,(pprint *)((ulong)local_228 & 0xffffffff),n);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
    paVar1 = &local_258.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               CONCAT16(local_258.field_2._M_local_buf[6],
                                        CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                 local_258.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_258.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_258.field_2._M_allocated_capacity._4_2_ = 0x3474;
    local_258._M_string_length = 6;
    local_258.field_2._M_local_buf[6] = '\0';
    local_258._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)(local_230->_metas).interpolation,
               (long)(local_230->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               CONCAT16(local_258.field_2._M_local_buf[6],
                                        CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                 local_258.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if (this[0x268] == (tinyusdz)0x1) {
      pcVar9 = " = None";
      lVar8 = 7;
LAB_002fdd49:
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar9,lVar8);
    }
    else if (((byte)tVar4 & bVar5) != 0) {
      if (local_220 == (tinyusdz)0x0) goto LAB_002fe110;
      if ((local_208._1_1_ != '\0') || ((byte)local_208 != '\x01')) {
        pcVar9 = " = [InternalError]";
        lVar8 = 0x12;
        goto LAB_002fdd49;
      }
      local_258._M_dataplus._M_p = (pointer)local_218;
      local_258._M_string_length = sStack_210;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      ::std::operator<<(local_1a8,(float4 *)&local_258);
    }
    bVar10 = AttrMetas::authored((AttrMetas *)this);
    if (bVar10) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      print_attr_metas_abi_cxx11_(&local_258,this,(AttrMeta *)(ulong)((int)psVar3 + 1),indent_00);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)psVar3 & 0xffffffff),n_00);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar1) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT17(local_258.field_2._M_local_buf[7],
                                 CONCAT16(local_258.field_2._M_local_buf[6],
                                          CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                   local_258.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  psVar3 = local_228;
  if ((char)local_234 != '\0') {
    pprint::Indent_abi_cxx11_(&local_258,(pprint *)((ulong)local_228 & 0xffffffff),n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
    paVar1 = &local_258.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               CONCAT16(local_258.field_2._M_local_buf[6],
                                        CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                 local_258.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_258.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_258.field_2._M_allocated_capacity._4_2_ = 0x3474;
    local_258._M_string_length = 6;
    local_258.field_2._M_local_buf[6] = '\0';
    local_258._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)(local_230->_metas).interpolation,
               (long)(local_230->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               CONCAT16(local_258.field_2._M_local_buf[6],
                                        CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                 local_258.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
    if (local_220 == (tinyusdz)0x0) {
LAB_002fe110:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,
                    "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float, 4>>>::value() const [T = tinyusdz::Animatable<std::array<float, 4>>]"
                   );
    }
    print_typed_timesamples<std::array<float,4ul>>
              (&local_258,(tinyusdz *)&local_200,
               (TypedTimeSamples<std::array<float,_4UL>_> *)((ulong)psVar3 & 0xffffffff),indent_00);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               CONCAT16(local_258.field_2._M_local_buf[6],
                                        CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                 local_258.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX_00;
  }
  if (*(long *)(this + 0x218) != *(long *)(this + 0x210)) {
    pprint::Indent_abi_cxx11_(&local_258,(pprint *)((ulong)psVar3 & 0xffffffff),n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
    paVar1 = &local_258.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               CONCAT16(local_258.field_2._M_local_buf[6],
                                        CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                 local_258.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_258.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_258.field_2._M_allocated_capacity._4_2_ = 0x3474;
    local_258._M_string_length = 6;
    local_258.field_2._M_local_buf[6] = '\0';
    local_258._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)(local_230->_metas).interpolation,
               (long)(local_230->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               CONCAT16(local_258.field_2._M_local_buf[6],
                                        CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                 local_258.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    lVar8 = (*(long *)(this + 0x218) - (long)*(Path **)(this + 0x210) >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar8 == 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar8 == 1) {
      ::std::operator<<(local_1a8,*(Path **)(this + 0x210));
    }
    else {
      ::std::operator<<(local_1a8,
                        (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(this + 0x210));
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  __return_storage_ptr__ = local_1e0;
  if ((local_220 == (tinyusdz)0x1) &&
     (local_200._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_200._samples.
                    super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_200._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_200._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    __return_storage_ptr__ = local_1e0;
  }
LAB_002fe0b7:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}